

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::RegisterInstruction(ValidationState_t *this,Instruction *inst)

{
  uint32_t uVar1;
  Op OVar2;
  StorageClass SVar3;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_00;
  spv_parsed_operand_t *psVar4;
  Instruction *this_01;
  Function *pFVar5;
  pair<unsigned_int,_spvtools::val::Instruction_*> pVar6;
  Instruction *operand_inst;
  uint32_t operand_word;
  spv_parsed_operand_t *operand;
  size_t i;
  uint32_t local_2c;
  pair<unsigned_int,_spvtools::val::Instruction_*> local_28;
  Instruction *local_18;
  Instruction *inst_local;
  ValidationState_t *this_local;
  
  local_18 = inst;
  inst_local = (Instruction *)this;
  uVar1 = val::Instruction::id(inst);
  if (uVar1 != 0) {
    local_2c = val::Instruction::id(local_18);
    pVar6 = std::make_pair<unsigned_int,spvtools::val::Instruction*&>(&local_2c,&local_18);
    local_28.second = pVar6.second;
    local_28.first = pVar6.first;
    std::
    unordered_map<unsigned_int,spvtools::val::Instruction*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Instruction*>>>
    ::insert<std::pair<unsigned_int,spvtools::val::Instruction*>>
              ((unordered_map<unsigned_int,spvtools::val::Instruction*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Instruction*>>>
                *)&this->all_definitions_,&local_28);
  }
  operand = (spv_parsed_operand_t *)0x0;
  while( true ) {
    this_00 = val::Instruction::operands(local_18);
    psVar4 = (spv_parsed_operand_t *)
             std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this_00)
    ;
    if (psVar4 <= operand) break;
    psVar4 = val::Instruction::operand(local_18,(size_t)operand);
    if ((psVar4->type == SPV_OPERAND_TYPE_ID) || (psVar4->type == SPV_OPERAND_TYPE_TYPE_ID)) {
      uVar1 = val::Instruction::word(local_18,(ulong)psVar4->offset);
      this_01 = FindDef(this,uVar1);
      if (this_01 != (Instruction *)0x0) {
        if ((psVar4->type == SPV_OPERAND_TYPE_ID) &&
           (OVar2 = val::Instruction::opcode(this_01), OVar2 == OpSampledImage)) {
          RegisterSampledImageConsumer(this,uVar1,local_18);
        }
        pFVar5 = val::Instruction::function(local_18);
        if (pFVar5 != (Function *)0x0) {
          OVar2 = val::Instruction::opcode(this_01);
          if (OVar2 == OpTypePointer) {
            SVar3 = val::Instruction::GetOperandAs<spv::StorageClass>(this_01,1);
            RegisterStorageClassConsumer(this,SVar3,local_18);
          }
          else {
            OVar2 = val::Instruction::opcode(this_01);
            if (OVar2 == OpVariable) {
              SVar3 = val::Instruction::GetOperandAs<spv::StorageClass>(this_01,2);
              RegisterStorageClassConsumer(this,SVar3,local_18);
            }
          }
        }
      }
    }
    operand = (spv_parsed_operand_t *)((long)&operand->offset + 1);
  }
  return;
}

Assistant:

void ValidationState_t::RegisterInstruction(Instruction* inst) {
  if (inst->id()) all_definitions_.insert(std::make_pair(inst->id(), inst));

  // Some validation checks are easier by getting all the consumers
  for (size_t i = 0; i < inst->operands().size(); ++i) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    if ((SPV_OPERAND_TYPE_ID == operand.type) ||
        (SPV_OPERAND_TYPE_TYPE_ID == operand.type)) {
      const uint32_t operand_word = inst->word(operand.offset);
      Instruction* operand_inst = FindDef(operand_word);
      if (!operand_inst) {
        continue;
      }

      // If the instruction is using an OpTypeSampledImage as an operand, it
      // should be recorded. The validator will ensure that all usages of an
      // OpTypeSampledImage and its definition are in the same basic block.
      if ((SPV_OPERAND_TYPE_ID == operand.type) &&
          (spv::Op::OpSampledImage == operand_inst->opcode())) {
        RegisterSampledImageConsumer(operand_word, inst);
      }

      // In order to track storage classes (not Function) used per execution
      // model we can't use RegisterExecutionModelLimitation on instructions
      // like OpTypePointer which are going to be in the pre-function section.
      // Instead just need to register storage class usage for consumers in a
      // function block.
      if (inst->function()) {
        if (operand_inst->opcode() == spv::Op::OpTypePointer) {
          RegisterStorageClassConsumer(
              operand_inst->GetOperandAs<spv::StorageClass>(1), inst);
        } else if (operand_inst->opcode() == spv::Op::OpVariable) {
          RegisterStorageClassConsumer(
              operand_inst->GetOperandAs<spv::StorageClass>(2), inst);
        }
      }
    }
  }
}